

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  RepeatedField<long> *this;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  SGDOptimizer *pSVar4;
  long lVar5;
  NetworkUpdateParameters *pNVar6;
  Optimizer *pOVar7;
  AdamOptimizer *pAVar8;
  Int64Parameter *pIVar9;
  Int64Set *pIVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  Int64Range *pIVar13;
  _Rb_tree_header *p_Var14;
  long tmp;
  Arena *pAVar15;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    uVar3 = (nn->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pNVar6 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar15);
    nn->updateparams_ = pNVar6;
  }
  pNVar6 = nn->updateparams_;
  if (pNVar6->optimizer_ == (Optimizer *)0x0) {
    uVar3 = (pNVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pOVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Optimizer>(pAVar15);
    pNVar6->optimizer_ = pOVar7;
  }
  pOVar7 = pNVar6->optimizer_;
  if (optimizerType == kAdamOptimizer) {
    if (pOVar7->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar7);
      pOVar7->_oneof_case_[0] = 0xb;
      uVar3 = (pOVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar15 = *(Arena **)pAVar15;
      }
      pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::AdamOptimizer>
                         (pAVar15);
LAB_001c1717:
      (pOVar7->OptimizerType_).sgdoptimizer_ = (SGDOptimizer *)pAVar8;
    }
  }
  else {
    if (optimizerType != kSgdOptimizer) {
      pIVar9 = (Int64Parameter *)0x0;
      goto LAB_001c174f;
    }
    if (pOVar7->_oneof_case_[0] != 10) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar7);
      pOVar7->_oneof_case_[0] = 10;
      uVar3 = (pOVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar15 = *(Arena **)pAVar15;
      }
      pAVar8 = (AdamOptimizer *)
               google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SGDOptimizer>
                         (pAVar15);
      goto LAB_001c1717;
    }
  }
  pSVar4 = (pOVar7->OptimizerType_).sgdoptimizer_;
  if (pSVar4->minibatchsize_ == (Int64Parameter *)0x0) {
    uVar3 = (pSVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pIVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Parameter>
                       (pAVar15);
    pSVar4->minibatchsize_ = pIVar9;
  }
  pIVar9 = pSVar4->minibatchsize_;
LAB_001c174f:
  pIVar9->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (pIVar9->_oneof_case_[0] != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar9);
      pIVar9->_oneof_case_[0] = 10;
      uVar3 = (pIVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar15 = *(Arena **)pAVar15;
      }
      pIVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>
                          (pAVar15);
      (pIVar9->AllowedValues_).range_ = pIVar13;
    }
    pIVar13 = (pIVar9->AllowedValues_).range_;
    pIVar13->minvalue_ = minValue;
    pIVar13->maxvalue_ = maxValue;
  }
  else {
    if (pIVar9->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar9);
      pIVar9->_oneof_case_[0] = 0xb;
      uVar3 = (pIVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar15 = *(Arena **)pAVar15;
      }
      pIVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Set>
                          (pAVar15);
      (pIVar9->AllowedValues_).set_ = pIVar10;
    }
    p_Var12 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var14) {
      pIVar10 = (pIVar9->AllowedValues_).set_;
      this = &pIVar10->values_;
      do {
        lVar5 = *(long *)(p_Var12 + 1);
        uVar1 = (pIVar10->values_).current_size_;
        uVar2 = (pIVar10->values_).total_size_;
        if (uVar1 == uVar2) {
          google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
        }
        plVar11 = google::protobuf::RepeatedField<long>::elements(this);
        plVar11[uVar1] = lVar5;
        this->current_size_ = uVar1 + 1;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var14);
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}